

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O0

void btSoftRigidDynamicsWorld::rayTestSingle
               (btTransform *rayFromTrans,btTransform *rayToTrans,btCollisionObject *collisionObject
               ,btCollisionShape *collisionShape,btTransform *colObjWorldTransform,
               RayResultCallback *resultCallback)

{
  bool bVar1;
  btSoftBody *results;
  btVector3 *rayTo;
  btVector3 *v;
  Face *pFVar2;
  btCollisionObject *in_RDX;
  btTransform *in_RSI;
  btTransform *in_RDI;
  long *in_R9;
  btScalar bVar3;
  bool normalInWorldSpace;
  LocalRayResult rayResult;
  btVector3 normal;
  btVector3 rayDir;
  LocalShapeInfo shapeInfo;
  sRayCast softResult;
  btSoftBody *softBody;
  btCollisionObject *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  btSoftBody *in_stack_ffffffffffffff50;
  RayResultCallback *in_stack_ffffffffffffff58;
  btTransform *in_stack_ffffffffffffff60;
  btCollisionShape *in_stack_ffffffffffffff68;
  btCollisionObject *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  btVector3 local_78;
  btVector3 local_68;
  LocalShapeInfo local_58 [2];
  int local_48;
  int local_44;
  float local_40;
  btSoftBody *local_38;
  long *local_30;
  btCollisionObject *local_18;
  btTransform *local_10;
  btTransform *local_8;
  
  local_30 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = btCollisionShape::isSoftBody((btCollisionShape *)0x297934);
  if (bVar1) {
    results = btSoftBody::upcast(in_stack_ffffffffffffff28);
    if (results != (btSoftBody *)0x0) {
      local_38 = results;
      rayTo = btTransform::getOrigin(local_8);
      btTransform::getOrigin(local_10);
      bVar1 = btSoftBody::rayTest(in_stack_ffffffffffffff50,
                                  (btVector3 *)
                                  CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                                  rayTo,(sRayCast *)results);
      if ((bVar1) && (local_40 <= *(float *)(local_30 + 1))) {
        local_58[0].m_shapePart = 0;
        local_58[0].m_triangleIndex = local_44;
        v = btTransform::getOrigin(local_10);
        btTransform::getOrigin(local_8);
        local_68 = operator-(rayTo,(btVector3 *)results);
        local_78 = operator-(v);
        btVector3::normalize(v);
        if (local_48 == 3) {
          pFVar2 = btAlignedObjectArray<btSoftBody::Face>::operator[](&local_38->m_faces,local_44);
          local_78.m_floats = *&(pFVar2->m_normal).m_floats;
          bVar3 = btVector3::dot(&local_78,&local_68);
          if (0.0 < bVar3) {
            local_78 = operator-(v);
          }
        }
        btCollisionWorld::LocalRayResult::LocalRayResult
                  ((LocalRayResult *)&stack0xffffffffffffff50,local_18,local_58,&local_78,local_40);
        (**(code **)(*local_30 + 0x18))(local_30,&stack0xffffffffffffff50,1);
      }
    }
  }
  else {
    btCollisionWorld::rayTestSingle
              (in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::rayTestSingle(const btTransform& rayFromTrans,const btTransform& rayToTrans,
					  btCollisionObject* collisionObject,
					  const btCollisionShape* collisionShape,
					  const btTransform& colObjWorldTransform,
					  RayResultCallback& resultCallback)
{
	if (collisionShape->isSoftBody()) {
		btSoftBody* softBody = btSoftBody::upcast(collisionObject);
		if (softBody) {
			btSoftBody::sRayCast softResult;
			if (softBody->rayTest(rayFromTrans.getOrigin(), rayToTrans.getOrigin(), softResult)) 
			{
				
				if (softResult.fraction<= resultCallback.m_closestHitFraction)
				{

					btCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = 0;
					shapeInfo.m_triangleIndex = softResult.index;
					// get the normal
					btVector3 rayDir = rayToTrans.getOrigin() - rayFromTrans.getOrigin();
					btVector3 normal=-rayDir;
					normal.normalize();

					if (softResult.feature == btSoftBody::eFeature::Face)
					{
						normal = softBody->m_faces[softResult.index].m_normal;
						if (normal.dot(rayDir) > 0) {
							// normal always point toward origin of the ray
							normal = -normal;
						}
					}
	
					btCollisionWorld::LocalRayResult rayResult
						(collisionObject,
						 &shapeInfo,
						 normal,
						 softResult.fraction);
					bool	normalInWorldSpace = true;
					resultCallback.addSingleResult(rayResult,normalInWorldSpace);
				}
			}
		}
	} 
	else {
		btCollisionWorld::rayTestSingle(rayFromTrans,rayToTrans,collisionObject,collisionShape,colObjWorldTransform,resultCallback);
	}
}